

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CNetAddr::IsBindAny(CNetAddr *this)

{
  CNetAddr *pCVar1;
  CNetAddr *pCVar2;
  uint uVar3;
  CNetAddr *pCVar4;
  int iVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  if (1 < this->m_net - NET_IPV4) {
    bVar6 = false;
    goto LAB_00d4e98a;
  }
  uVar3 = (this->m_addr)._size;
  if (0x10 < uVar3) {
    this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    uVar3 = uVar3 - 0x11;
  }
  pCVar1 = (CNetAddr *)((this->m_addr)._union.direct + (int)uVar3);
  if (0 < (int)uVar3 >> 2) {
    iVar5 = ((int)uVar3 >> 2) + 1;
    pCVar2 = (CNetAddr *)((long)&(this->m_addr)._union + 3);
    do {
      pCVar4 = pCVar2;
      if (*(char *)((long)&pCVar4[-1].m_scope_id + 1) != '\0') {
        pCVar4 = (CNetAddr *)((long)&pCVar4[-1].m_scope_id + 1);
        goto LAB_00d4e984;
      }
      if (*(char *)((long)&pCVar4[-1].m_scope_id + 2) != '\0') {
        pCVar4 = (CNetAddr *)((long)&pCVar4[-1].m_scope_id + 2);
        goto LAB_00d4e984;
      }
      if (*(char *)((long)&pCVar4[-1].m_scope_id + 3) != '\0') {
        pCVar4 = (CNetAddr *)((long)&pCVar4[-1].m_scope_id + 3);
        goto LAB_00d4e984;
      }
      if ((pCVar4->m_addr)._union.direct[0] != '\0') goto LAB_00d4e984;
      iVar5 = iVar5 + -1;
      uVar3 = uVar3 - 4;
      pCVar2 = (CNetAddr *)((long)&(pCVar4->m_addr)._union + 4);
    } while (1 < iVar5);
    this = (CNetAddr *)((long)&(pCVar4->m_addr)._union + 1);
  }
  if (uVar3 == 1) {
LAB_00d4e969:
    pCVar4 = this;
    if ((this->m_addr)._union.direct[0] == '\0') {
      pCVar4 = pCVar1;
    }
  }
  else if (uVar3 == 2) {
LAB_00d4e961:
    pCVar4 = this;
    if ((this->m_addr)._union.direct[0] == '\0') {
      this = (CNetAddr *)((long)&(this->m_addr)._union + 1);
      goto LAB_00d4e969;
    }
  }
  else {
    pCVar4 = pCVar1;
    if ((uVar3 == 3) && (pCVar4 = this, (this->m_addr)._union.direct[0] == '\0')) {
      this = (CNetAddr *)((long)&(this->m_addr)._union + 1);
      goto LAB_00d4e961;
    }
  }
LAB_00d4e984:
  bVar6 = pCVar4 == pCVar1;
LAB_00d4e98a:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool CNetAddr::IsBindAny() const
{
    if (!IsIPv4() && !IsIPv6()) {
        return false;
    }
    return std::all_of(m_addr.begin(), m_addr.end(), [](uint8_t b) { return b == 0; });
}